

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.h
# Opt level: O1

UnicodeString * __thiscall
icu_63::UnicodeString::setTo(UnicodeString *this,UnicodeString *srcText,int32_t srcStart)

{
  short sVar1;
  int iVar2;
  UnicodeString *pUVar3;
  int32_t length;
  int32_t iVar4;
  
  unBogus(this);
  if (srcStart < 0) {
    srcStart = 0;
  }
  else {
    sVar1 = (srcText->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar2 = (srcText->fUnion).fFields.fLength;
    }
    else {
      iVar2 = (int)sVar1 >> 5;
    }
    if (iVar2 < srcStart) {
      srcStart = iVar2;
    }
  }
  sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    length = (this->fUnion).fFields.fLength;
  }
  else {
    length = (int)sVar1 >> 5;
  }
  sVar1 = (srcText->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar4 = (srcText->fUnion).fFields.fLength;
  }
  else {
    iVar4 = (int)sVar1 >> 5;
  }
  pUVar3 = doReplace(this,0,length,srcText,srcStart,iVar4 - srcStart);
  return pUVar3;
}

Assistant:

inline UnicodeString&
UnicodeString::setTo(const UnicodeString& srcText,
             int32_t srcStart)
{
  unBogus();
  srcText.pinIndex(srcStart);
  return doReplace(0, length(), srcText, srcStart, srcText.length() - srcStart);
}